

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSelect.c
# Opt level: O2

Fxu_Double * Fxu_MatrixFindDouble(Fxu_Matrix *p,int *piVarsC1,int *piVarsC2,int nVarsC1,int nVarsC2)

{
  Fxu_Double *pDouble;
  Fxu_Pair *pFVar1;
  uint uVar2;
  ulong uVar3;
  Fxu_Matrix *p_00;
  Fxu_ListDouble *pFVar4;
  int nVarsC2_;
  int nVarsC1_;
  int piVarsC2_ [100];
  int piVarsC1_ [100];
  int local_360;
  int local_35c;
  int local_358 [100];
  int local_1c8 [102];
  
  if (nVarsC1 < 1) {
    __assert_fail("nVarsC1 > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSelect.c"
                  ,0x1db,"Fxu_Double *Fxu_MatrixFindDouble(Fxu_Matrix *, int *, int *, int, int)");
  }
  if (nVarsC2 < 1) {
    __assert_fail("nVarsC2 > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSelect.c"
                  ,0x1dc,"Fxu_Double *Fxu_MatrixFindDouble(Fxu_Matrix *, int *, int *, int, int)");
  }
  if (*piVarsC2 <= *piVarsC1) {
    __assert_fail("piVarsC1[0] < piVarsC2[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSelect.c"
                  ,0x1dd,"Fxu_Double *Fxu_MatrixFindDouble(Fxu_Matrix *, int *, int *, int, int)");
  }
  p_00 = p;
  uVar2 = Fxu_PairHashKeyArray(p,piVarsC1,piVarsC2,nVarsC1,nVarsC2);
  pFVar4 = p->pTable + (ulong)uVar2 % (ulong)(uint)p->nTableSize;
  do {
    pDouble = pFVar4->pHead;
    if (pDouble == (Fxu_Double *)0x0) {
      return (Fxu_Double *)0x0;
    }
    pFVar1 = (pDouble->lPairs).pHead;
    if ((pFVar1->nLits1 == nVarsC1) && (pFVar1->nLits2 == nVarsC2)) {
      Fxu_MatrixGetDoubleVars(p_00,pDouble,local_1c8,local_358,&local_35c,&local_360);
      for (uVar3 = 0; (uint)nVarsC1 != uVar3; uVar3 = uVar3 + 1) {
        if (piVarsC1[uVar3] != local_1c8[uVar3]) {
          if (nVarsC1 != (int)uVar3) goto LAB_003abcbb;
          break;
        }
      }
      uVar3 = 0;
      while( true ) {
        if ((uint)nVarsC2 == uVar3) {
          return pDouble;
        }
        if (piVarsC2[uVar3] != local_358[uVar3]) break;
        uVar3 = uVar3 + 1;
      }
      if (nVarsC2 == (int)uVar3) {
        return pDouble;
      }
    }
LAB_003abcbb:
    pFVar4 = (Fxu_ListDouble *)&pDouble->pNext;
  } while( true );
}

Assistant:

Fxu_Double * Fxu_MatrixFindDouble( Fxu_Matrix * p, 
     int piVarsC1[], int piVarsC2[], int nVarsC1, int nVarsC2 )
{
    int piVarsC1_[100], piVarsC2_[100];
    int nVarsC1_, nVarsC2_, i;
    Fxu_Double * pDouble;
    Fxu_Pair * pPair;
    unsigned Key;

    assert( nVarsC1 > 0 );
    assert( nVarsC2 > 0 );
    assert( piVarsC1[0] < piVarsC2[0] );

    // get the hash key
    Key = Fxu_PairHashKeyArray( p, piVarsC1, piVarsC2, nVarsC1, nVarsC2 );
    
    // check if the divisor for this pair already exists
    Key %= p->nTableSize;
	Fxu_TableForEachDouble( p, Key, pDouble )
    {
        pPair = pDouble->lPairs.pHead;
        if ( pPair->nLits1 != nVarsC1 )
            continue;
        if ( pPair->nLits2 != nVarsC2 )
            continue;
        // get the cubes of this divisor
        Fxu_MatrixGetDoubleVars( p, pDouble, piVarsC1_, piVarsC2_, &nVarsC1_, &nVarsC2_ );
        // compare lits of the first cube
        for ( i = 0; i < nVarsC1; i++ )
            if ( piVarsC1[i] != piVarsC1_[i] )
                break;
        if ( i != nVarsC1 )
            continue;
        // compare lits of the second cube
        for ( i = 0; i < nVarsC2; i++ )
            if ( piVarsC2[i] != piVarsC2_[i] )
                break;
        if ( i != nVarsC2 )
            continue;
        return pDouble;
    }
    return NULL;
}